

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::PositionColorShader::shadeFragments
          (PositionColorShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int fragNdx_00;
  int packetNdx_00;
  FragmentShadingContext *context_00;
  Vector<float,_4> local_4c;
  int local_3c;
  FragmentPacket *pFStack_38;
  int fragNdx;
  FragmentPacket *packet;
  FragmentShadingContext *pFStack_28;
  int packetNdx;
  FragmentShadingContext *context_local;
  FragmentPacket *pFStack_18;
  int numPackets_local;
  FragmentPacket *packets_local;
  PositionColorShader *this_local;
  
  pFStack_28 = context;
  context_local._4_4_ = numPackets;
  pFStack_18 = packets;
  packets_local = (FragmentPacket *)this;
  for (packet._4_4_ = 0; packet._4_4_ < context_local._4_4_; packet._4_4_ = packet._4_4_ + 1) {
    pFStack_38 = pFStack_18 + packet._4_4_;
    for (local_3c = 0; context_00 = pFStack_28, packetNdx_00 = packet._4_4_, fragNdx_00 = local_3c,
        local_3c < 4; local_3c = local_3c + 1) {
      rr::readTriangleVarying<float>((rr *)&local_4c,pFStack_38,pFStack_28,0,local_3c);
      rr::writeFragmentOutput<tcu::Vector<float,4>>(context_00,packetNdx_00,fragNdx_00,0,&local_4c);
    }
  }
  return;
}

Assistant:

void PositionColorShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::FragmentPacket& packet = packets[packetNdx];

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, rr::readVarying<float>(packet, context, VARYINGLOC_COLOR, fragNdx));
	}
}